

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::PushDollar(ParseState *this)

{
  bool bVar1;
  ParseFlags PVar2;
  ParseFlags PVar3;
  ParseFlags *in_RDI;
  ParseState *unaff_retaddr;
  bool ret;
  ParseFlags oflags;
  RegexpOp in_stack_fffffffffffffffc;
  
  PVar2 = operator&(*in_RDI,OneLine);
  if (PVar2 == NoParseFlags) {
    bVar1 = PushSimpleOp(unaff_retaddr,in_stack_fffffffffffffffc);
  }
  else {
    PVar2 = *in_RDI;
    PVar3 = operator|(*in_RDI,WasDollar);
    *in_RDI = PVar3;
    bVar1 = PushSimpleOp(unaff_retaddr,in_stack_fffffffffffffffc);
    *in_RDI = PVar2;
  }
  return bVar1;
}

Assistant:

bool Regexp::ParseState::PushDollar() {
  if (flags_ & OneLine) {
    // Clumsy marker so that MimicsPCRE() can tell whether
    // this kRegexpEndText was a $ and not a \z.
    Regexp::ParseFlags oflags = flags_;
    flags_ = flags_ | WasDollar;
    bool ret = PushSimpleOp(kRegexpEndText);
    flags_ = oflags;
    return ret;
  }
  return PushSimpleOp(kRegexpEndLine);
}